

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O1

void __thiscall Fl_Tabs::draw_tab(Fl_Tabs *this,int x1,int x2,int W,int H,Fl_Widget *o,int what)

{
  byte bVar1;
  Fl_Color FVar2;
  bool bVar3;
  ulong uVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  Fl_Color FVar8;
  Fl_Tabs *pFVar9;
  int iVar10;
  int X;
  ulong uVar11;
  Fl_Boxtype t;
  uint uVar12;
  
  bVar3 = what != 2;
  iVar6 = Fl::box_dh((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  iVar7 = Fl::box_dy((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  cVar5 = fl_draw_shortcut;
  fl_draw_shortcut = '\x01';
  bVar1 = (this->super_Fl_Group).super_Fl_Widget.box_;
  t = (Fl_Boxtype)((1 < bVar1 && (this->push_ == o && bVar3)) | bVar1);
  iVar10 = (uint)(what == 2) * 2;
  uVar12 = (uint)bVar3;
  uVar11 = (ulong)(uint)(x2 - W);
  if (what != 1) {
    uVar11 = (ulong)(uint)x1;
  }
  if (x1 + W <= x2) {
    uVar11 = (ulong)(uint)x1;
  }
  X = (int)uVar11;
  if (H < 0) {
    if (what == 2) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
                (fl_graphics_driver,uVar11,
                 (ulong)(uint)((H - iVar7) + (this->super_Fl_Group).super_Fl_Widget.y_ +
                              (this->super_Fl_Group).super_Fl_Widget.h_),(ulong)(uint)(x2 - X),
                 (ulong)(uint)(iVar7 - H));
      pFVar9 = this;
    }
    else {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
                (fl_graphics_driver,uVar11,
                 (ulong)(uint)((this->super_Fl_Group).super_Fl_Widget.y_ + H +
                              (this->super_Fl_Group).super_Fl_Widget.h_),(ulong)(uint)(x2 - X),
                 (ulong)(uint)-H);
      pFVar9 = (Fl_Tabs *)o;
    }
    iVar6 = iVar6 - H;
    Fl_Widget::draw_box((Fl_Widget *)this,t,X,
                        ((this->super_Fl_Group).super_Fl_Widget.y_ - iVar6) +
                        (this->super_Fl_Group).super_Fl_Widget.h_ + -10,W,iVar10 + 8 + iVar6,
                        (pFVar9->super_Fl_Group).super_Fl_Widget.color2_);
    FVar2 = (o->label_).color;
    FVar8 = FVar2;
    if (what == 2) {
      FVar8 = (this->super_Fl_Group).super_Fl_Widget.label_.color;
    }
    (o->label_).color = FVar8;
    Fl_Widget::draw_label
              (o,X,((this->super_Fl_Group).super_Fl_Widget.y_ - iVar6) +
                   (this->super_Fl_Group).super_Fl_Widget.h_,W,iVar6 + uVar12 * -2,0);
    (o->label_).color = FVar2;
    if (((Fl_Tabs *)Fl::focus_ != this) || ((o->flags_ & 2) != 0)) goto LAB_001ce4e6;
    bVar1 = (this->super_Fl_Group).super_Fl_Widget.box_;
    iVar10 = ((this->super_Fl_Group).super_Fl_Widget.y_ - iVar6) +
             (this->super_Fl_Group).super_Fl_Widget.h_;
  }
  else {
    iVar6 = iVar6 + H;
    pFVar9 = this;
    uVar4 = (ulong)(uint)(iVar6 - iVar7);
    if (what != 2) {
      pFVar9 = (Fl_Tabs *)o;
      uVar4 = (ulong)(uint)H;
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
              (fl_graphics_driver,uVar11,(ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.y_,
               (ulong)(uint)(x2 - X),uVar4);
    Fl_Widget::draw_box((Fl_Widget *)this,t,X,(this->super_Fl_Group).super_Fl_Widget.y_ + uVar12 * 2
                        ,W,iVar10 + iVar6 + 8,(pFVar9->super_Fl_Group).super_Fl_Widget.color2_);
    FVar2 = (o->label_).color;
    FVar8 = FVar2;
    if (what == 2) {
      FVar8 = (this->super_Fl_Group).super_Fl_Widget.label_.color;
    }
    (o->label_).color = FVar8;
    Fl_Widget::draw_label
              (o,X,uVar12 * 2 + (this->super_Fl_Group).super_Fl_Widget.y_,W,iVar6 + uVar12 * -2,0);
    (o->label_).color = FVar2;
    if (((Fl_Tabs *)Fl::focus_ != this) || ((o->flags_ & 2) != 0)) goto LAB_001ce4e6;
    bVar1 = (this->super_Fl_Group).super_Fl_Widget.box_;
    iVar10 = (this->super_Fl_Group).super_Fl_Widget.y_;
  }
  Fl_Widget::draw_focus((Fl_Widget *)this,(uint)bVar1,X,iVar10,W,iVar6);
LAB_001ce4e6:
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  fl_draw_shortcut = cVar5;
  return;
}

Assistant:

void Fl_Tabs::draw_tab(int x1, int x2, int W, int H, Fl_Widget* o, int what) {
  int sel = (what == SELECTED);
  int dh = Fl::box_dh(box());
  int dy = Fl::box_dy(box());
  char prev_draw_shortcut = fl_draw_shortcut;
  fl_draw_shortcut = 1;

  Fl_Boxtype bt = (o==push_ &&!sel) ? fl_down(box()) : box();

  // compute offsets to make selected tab look bigger
  int yofs = sel ? 0 : BORDER;

  if ((x2 < x1+W) && what == RIGHT) x1 = x2 - W;

  if (H >= 0) {
    if (sel) fl_push_clip(x1, y(), x2 - x1, H + dh - dy);
    else fl_push_clip(x1, y(), x2 - x1, H);

    H += dh;

    Fl_Color c = sel ? selection_color() : o->selection_color();

    draw_box(bt, x1, y() + yofs, W, H + 10 - yofs, c);

    // Save the previous label color
    Fl_Color oc = o->labelcolor();

    // Draw the label using the current color...
    o->labelcolor(sel ? labelcolor() : o->labelcolor());
    o->draw_label(x1, y() + yofs, W, H - yofs, FL_ALIGN_CENTER);

    // Restore the original label color...
    o->labelcolor(oc);

    if (Fl::focus() == this && o->visible())
      draw_focus(box(), x1, y(), W, H);

    fl_pop_clip();
  } else {
    H = -H;

    if (sel) fl_push_clip(x1, y() + h() - H - dy, x2 - x1, H + dy);
    else fl_push_clip(x1, y() + h() - H, x2 - x1, H);

    H += dh;

    Fl_Color c = sel ? selection_color() : o->selection_color();

    draw_box(bt, x1, y() + h() - H - 10, W, H + 10 - yofs, c);

    // Save the previous label color
    Fl_Color oc = o->labelcolor();

    // Draw the label using the current color...
    o->labelcolor(sel ? labelcolor() : o->labelcolor());
    o->draw_label(x1, y() + h() - H, W, H - yofs, FL_ALIGN_CENTER);

    // Restore the original label color...
    o->labelcolor(oc);

    if (Fl::focus() == this && o->visible())
      draw_focus(box(), x1, y() + h() - H, W, H);

    fl_pop_clip();
  }
  fl_draw_shortcut = prev_draw_shortcut;
}